

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weapon.c
# Opt level: O0

int weapon_dam_bonus(obj *weapon)

{
  int iVar1;
  int local_3c;
  int local_24;
  int local_20;
  int local_1c;
  int bonus;
  int skill;
  int wep_type;
  int type;
  obj *weapon_local;
  
  local_20 = 0;
  iVar1 = weapon_type(weapon);
  local_24 = iVar1;
  if ((u.twoweap != '\0') && ((weapon == uwep || (weapon == uswapwep)))) {
    local_24 = 0x26;
  }
  if (local_24 == 0) {
    local_20 = 0;
  }
  else if (local_24 < 0x1e) {
    switch(u.weapon_skills[local_24].skill) {
    case '\x01':
      local_20 = -2;
      break;
    case '\x02':
      local_20 = 0;
      break;
    case '\x03':
      local_20 = 1;
      break;
    case '\x04':
      local_20 = 3;
      break;
    default:
      impossible("weapon_dam_bonus: bad skill %d",(ulong)(uint)(int)u.weapon_skills[local_24].skill)
      ;
    case '\0':
      local_20 = -5;
    }
  }
  else if (local_24 == 0x26) {
    local_1c = (int)u.weapon_skills[0x26].skill;
    if (u.weapon_skills[iVar1].skill < local_1c) {
      local_1c = (int)u.weapon_skills[iVar1].skill;
    }
    switch(local_1c) {
    default:
      local_20 = -3;
      break;
    case 2:
      local_20 = -1;
      break;
    case 3:
      local_20 = 0;
      break;
    case 4:
      local_20 = 2;
    }
  }
  else if (local_24 == 0x25) {
    local_3c = (int)u.weapon_skills[0x25].skill;
    if (local_3c < 2) {
      local_3c = 1;
    }
    iVar1 = 1;
    if (urole.malenum == 0x165 || urole.malenum == 0x160) {
      iVar1 = 3;
    }
    local_20 = (local_3c * iVar1) / 2;
  }
  if ((u.usteed != (monst *)0x0) && (local_24 != 0x26)) {
    switch(u.weapon_skills[0x27].skill) {
    case '\0':
    case '\x01':
      break;
    case '\x02':
      break;
    case '\x03':
      local_20 = local_20 + 2;
      break;
    case '\x04':
      local_20 = local_20 + 5;
    }
  }
  return local_20;
}

Assistant:

int weapon_dam_bonus(struct obj *weapon)
{
    int type, wep_type, skill, bonus = 0;

    wep_type = weapon_type(weapon);
    /* use two weapon skill only if attacking with one of the wielded weapons */
    type = (u.twoweap && (weapon == uwep || weapon == uswapwep)) ?
	    P_TWO_WEAPON_COMBAT : wep_type;
    if (type == P_NONE) {
	bonus = 0;
    } else if (type <= P_LAST_WEAPON) {
	switch (P_SKILL(type)) {
	    default: impossible("weapon_dam_bonus: bad skill %d",P_SKILL(type));
		     /* fall through */
	    case P_ISRESTRICTED: bonus = -5; break;
	    case P_UNSKILLED:	bonus = -2; break;
	    case P_BASIC:	bonus =  0; break;
	    case P_SKILLED:	bonus =  1; break;
	    case P_EXPERT:	bonus =  3; break;
	}
    } else if (type == P_TWO_WEAPON_COMBAT) {
	skill = P_SKILL(P_TWO_WEAPON_COMBAT);
	if (P_SKILL(wep_type) < skill) skill = P_SKILL(wep_type);
	switch (skill) {
	    default:
	    case P_ISRESTRICTED:
	    case P_UNSKILLED:	bonus = -3; break;
	    case P_BASIC:	bonus = -1; break;
	    case P_SKILLED:	bonus = 0; break;
	    case P_EXPERT:	bonus = 2; break;
	}
    } else if (type == P_BARE_HANDED_COMBAT) {
	/*
	 *	       b.h.  m.a.
	 *	unskl:	 0   n/a
	 *	basic:	+1    +3
	 *	skild:	+1    +4
	 *	exprt:	+2    +6
	 *	mastr:	+2    +7
	 *	grand:	+3    +9
	 */
	bonus = P_SKILL(type);
	bonus = max(bonus,P_UNSKILLED) - 1;	/* unskilled => 0 */
	bonus = ((bonus + 1) * (martial_bonus() ? 3 : 1)) / 2;
    }

	/* KMH -- Riding gives some thrusting damage */
	if (u.usteed && type != P_TWO_WEAPON_COMBAT) {
		switch (P_SKILL(P_RIDING)) {
		    case P_ISRESTRICTED:
		    case P_UNSKILLED:   break;
		    case P_BASIC:       break;
		    case P_SKILLED:     bonus += 2; break;
		    case P_EXPERT:      bonus += 5; break;
		}
	}

    return bonus;
}